

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTDMT_bufferPool *pZVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t code;
  ZSTD_EndDirective in_ECX;
  ZSTD_outBuffer *in_RDX;
  ZSTDMT_CCtx *in_RSI;
  ZSTD_CCtx *in_RDI;
  size_t err_code_3;
  size_t err_code_2;
  size_t opos;
  size_t ipos;
  size_t flushMin;
  size_t err_code_1;
  size_t err_code;
  size_t totalInputSize;
  size_t inputSize;
  ZSTD_EndDirective in_stack_000000a4;
  ZSTD_inBuffer *in_stack_000000a8;
  ZSTD_outBuffer *in_stack_000000b0;
  ZSTD_CStream *in_stack_000000b8;
  size_t in_stack_000001d8;
  ZSTD_EndDirective in_stack_000001e4;
  ZSTD_CCtx *in_stack_000001e8;
  ZSTD_CCtx *in_stack_ffffffffffffff88;
  ZSTD_CCtx_params *in_stack_ffffffffffffffa8;
  ZSTDMT_CCtx *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_8;
  
  if (in_RSI->jobs < (ZSTDMT_jobDescription *)in_RSI->bufPool) {
    local_8 = 0xffffffffffffffba;
  }
  else if (in_RDX->size < in_RDX->pos) {
    local_8 = 0xffffffffffffffb8;
  }
  else if (in_ECX < (ZSTD_e_end|ZSTD_e_flush)) {
    if (in_RDI == (ZSTD_CCtx *)0x0) {
      __assert_fail("cctx != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x68fc,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (in_RDI->streamStage == zcss_init) {
      in_stack_ffffffffffffffd0 = in_RDX->size - in_RDX->pos;
      if ((((in_RDI->requestedParams).inBufferMode == ZSTD_bm_stable) && (in_ECX == ZSTD_e_continue)
          ) && (in_stack_ffffffffffffffd0 + in_RDI->stableIn_notConsumed < 0x20000)) {
        if (in_RDI->stableIn_notConsumed != 0) {
          if (in_RDX->dst != (in_RDI->expectedInBuffer).src) {
            return 0xffffffffffffffce;
          }
          if (in_RDX->pos != (in_RDI->expectedInBuffer).size) {
            return 0xffffffffffffffce;
          }
        }
        in_RDX->pos = in_RDX->size;
        (in_RDI->expectedInBuffer).src = in_RDX->dst;
        (in_RDI->expectedInBuffer).size = in_RDX->size;
        (in_RDI->expectedInBuffer).pos = in_RDX->pos;
        in_RDI->stableIn_notConsumed = in_stack_ffffffffffffffd0 + in_RDI->stableIn_notConsumed;
        iVar2 = 2;
        if ((in_RDI->requestedParams).format == ZSTD_f_zstd1) {
          iVar2 = 6;
        }
        return (long)iVar2;
      }
      sVar4 = ZSTD_CCtx_init_compressStream2(in_stack_000001e8,in_stack_000001e4,in_stack_000001d8);
      uVar3 = ERR_isError(sVar4);
      if (uVar3 != 0) {
        return sVar4;
      }
      ZSTD_setBufferExpectations(in_RDI,(ZSTD_outBuffer *)in_RSI,(ZSTD_inBuffer *)in_RDX);
    }
    local_8 = ZSTD_checkBufferStability
                        (in_RDI,(ZSTD_outBuffer *)in_RSI,(ZSTD_inBuffer *)in_RDX,in_ECX);
    uVar3 = ERR_isError(local_8);
    if (uVar3 == 0) {
      if ((in_RDI->appliedParams).nbWorkers < 1) {
        local_8 = ZSTD_compressStream_generic
                            (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4
                            );
        uVar3 = ERR_isError(local_8);
        if (uVar3 == 0) {
          ZSTD_setBufferExpectations(in_RDI,(ZSTD_outBuffer *)in_RSI,(ZSTD_inBuffer *)in_RDX);
          local_8 = in_RDI->outBuffContentSize - in_RDI->outBuffFlushedSize;
        }
      }
      else {
        if (in_RDI->cParamsChanged != 0) {
          ZSTDMT_updateCParams_whileCompressing(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
          ;
          in_RDI->cParamsChanged = 0;
        }
        if (in_RDI->stableIn_notConsumed != 0) {
          if ((in_RDI->appliedParams).inBufferMode != ZSTD_bm_stable) {
            __assert_fail("cctx->appliedParams.inBufferMode == ZSTD_bm_stable",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6922,
                          "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                         );
          }
          if (in_RDX->pos < in_RDI->stableIn_notConsumed) {
            __assert_fail("input->pos >= cctx->stableIn_notConsumed",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6924,
                          "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                         );
          }
          in_RDX->pos = in_RDX->pos - in_RDI->stableIn_notConsumed;
          in_RDI->stableIn_notConsumed = 0;
        }
        do {
          while( true ) {
            sVar4 = in_RDX->pos;
            pZVar1 = in_RSI->bufPool;
            code = ZSTDMT_compressStream_generic
                             (in_RSI,in_RDX,
                              (ZSTD_inBuffer *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                              (ZSTD_EndDirective)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
            in_RDI->consumedSrcSize = (in_RDX->pos - sVar4) + in_RDI->consumedSrcSize;
            in_RDI->producedCSize = (long)in_RSI->bufPool + (in_RDI->producedCSize - (long)pZVar1);
            uVar3 = ZSTD_isError(0x2aa1aa);
            if ((uVar3 != 0) || ((in_ECX == ZSTD_e_end && (code == 0)))) {
              if (code == 0) {
                ZSTD_CCtx_trace(in_RDI,0);
              }
              ZSTD_CCtx_reset(in_stack_ffffffffffffff88,0);
            }
            local_8 = code;
            uVar3 = ERR_isError(code);
            if (uVar3 != 0) {
              return code;
            }
            if (in_ECX != ZSTD_e_continue) break;
            if (((in_RDX->pos != sVar4) || (in_RSI->bufPool != pZVar1)) ||
               ((in_RDX->pos == in_RDX->size ||
                ((ZSTDMT_jobDescription *)in_RSI->bufPool == in_RSI->jobs)))) goto LAB_002aa2b6;
          }
          if ((in_ECX != ZSTD_e_flush) && (in_ECX != ZSTD_e_end)) {
            __assert_fail("endOp == ZSTD_e_flush || endOp == ZSTD_e_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x693e,
                          "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                         );
          }
        } while ((local_8 != 0) && ((ZSTDMT_jobDescription *)in_RSI->bufPool != in_RSI->jobs));
LAB_002aa2b6:
        if ((in_ECX != ZSTD_e_continue) &&
           ((local_8 != 0 && ((ZSTDMT_jobDescription *)in_RSI->bufPool != in_RSI->jobs)))) {
          __assert_fail("endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x694a,
                        "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        ZSTD_setBufferExpectations(in_RDI,(ZSTD_outBuffer *)in_RSI,(ZSTD_inBuffer *)in_RDX);
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffd6;
  }
  return local_8;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}